

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

CBlock * CreateGenesisBlock(CBlock *__return_storage_ptr__,char *pszTimestamp,
                           CScript *genesisOutputScript,uint32_t nTime,uint32_t nNonce,
                           uint32_t nBits,int32_t nVersion,CAmount *genesisReward)

{
  CScript *pCVar1;
  size_t sVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  undefined4 in_stack_0000000c;
  allocator_type local_b1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  CScriptNum local_98;
  CMutableTransaction txNew;
  undefined1 local_58 [24];
  pointer pCStack_40;
  pointer local_38;
  
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&txNew);
  txNew.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txNew.vin,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txNew.vout,1);
  local_58._16_8_ = 0;
  pCStack_40 = (pointer)0x0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  pCVar1 = CScript::push_int64((CScript *)local_58,0x1d00ffff);
  local_98.m_value = 4;
  pCVar1 = CScript::operator<<(pCVar1,&local_98);
  sVar2 = strlen(pszTimestamp);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b0,(uchar *)pszTimestamp,
             (uchar *)(pszTimestamp + sVar2),&local_b1);
  b._M_extent._M_extent_value =
       (long)local_b0._M_impl.super__Vector_impl_data._M_finish -
       (long)local_b0._M_impl.super__Vector_impl_data._M_start;
  b._M_ptr = local_b0._M_impl.super__Vector_impl_data._M_start;
  other = &CScript::operator<<(pCVar1,b)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txNew.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
  (txNew.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = *(CAmount *)CONCAT44(in_stack_0000000c,nVersion);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txNew.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &genesisOutputScript->super_CScriptBase);
  CBlock::CBlock(__return_storage_ptr__);
  (__return_storage_ptr__->super_CBlockHeader).nTime = nTime;
  (__return_storage_ptr__->super_CBlockHeader).nBits = nBits;
  (__return_storage_ptr__->super_CBlockHeader).nNonce = nNonce;
  (__return_storage_ptr__->super_CBlockHeader).nVersion = 1;
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)local_58);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&__return_storage_ptr__->vtx,(shared_ptr<const_CTransaction> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  base_blob<256U>::SetNull
            (&(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>);
  BlockMerkleRoot((uint256 *)local_58,__return_storage_ptr__,(bool *)0x0);
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_58._16_8_;
  *(pointer *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = pCStack_40;
  *(undefined8 *)
   (__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
       = local_58._0_8_;
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 8) = local_58._8_8_;
  CMutableTransaction::~CMutableTransaction(&txNew);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CBlock CreateGenesisBlock(const char* pszTimestamp, const CScript& genesisOutputScript, uint32_t nTime, uint32_t nNonce, uint32_t nBits, int32_t nVersion, const CAmount& genesisReward)
{
    CMutableTransaction txNew;
    txNew.version = 1;
    txNew.vin.resize(1);
    txNew.vout.resize(1);
    txNew.vin[0].scriptSig = CScript() << 486604799 << CScriptNum(4) << std::vector<unsigned char>((const unsigned char*)pszTimestamp, (const unsigned char*)pszTimestamp + strlen(pszTimestamp));
    txNew.vout[0].nValue = genesisReward;
    txNew.vout[0].scriptPubKey = genesisOutputScript;

    CBlock genesis;
    genesis.nTime    = nTime;
    genesis.nBits    = nBits;
    genesis.nNonce   = nNonce;
    genesis.nVersion = nVersion;
    genesis.vtx.push_back(MakeTransactionRef(std::move(txNew)));
    genesis.hashPrevBlock.SetNull();
    genesis.hashMerkleRoot = BlockMerkleRoot(genesis);
    return genesis;
}